

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrDEC0xce(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  Memory *unaff_retaddr;
  uint16_t address;
  CPU *pCVar1;
  
  pCVar1 = in_RDI;
  absolute_addr_j((CPU *)0x111c68);
  argument = Memory::Read8(in_RDI->m,(uint16_t)((ulong)in_RDI >> 0x30));
  DEC(in_RDI,argument);
  Memory::Write8(unaff_retaddr,(uint16_t)((ulong)pCVar1 >> 0x30),(uint8_t)((ulong)pCVar1 >> 0x28));
  return 6;
}

Assistant:

int CPU::instrDEC0xce() {
	uint16_t address = absolute_addr_j();
	m->Write8(address, DEC(m->Read8(address)));
	return 6;
}